

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.cpp
# Opt level: O0

void __thiscall
HighsPseudocostInitialization::HighsPseudocostInitialization
          (HighsPseudocostInitialization *this,HighsPseudocost *pscost,HighsInt maxCount,
          HighsPostsolveStack *postsolveStack)

{
  value_type vVar1;
  double dVar2;
  pointer pdVar3;
  int iVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  long *plVar7;
  size_type sVar8;
  const_reference pvVar9;
  reference pvVar10;
  const_reference pvVar11;
  int *piVar12;
  reference pvVar13;
  HighsPostsolveStack *in_RCX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  HighsInt i;
  HighsInt ncols;
  double in_stack_fffffffffffffdb8;
  HighsPostsolveStack *in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdd8;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int local_48;
  long local_40 [3];
  long local_28;
  HighsPostsolveStack *local_20;
  int local_14;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x688d06);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x688d1f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x688d38);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x688d51);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x688d6a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x688d83);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x688d9f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x688dbb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x688dd7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x688df3);
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_10[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_10[0xd].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_10[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = 1;
  plVar7 = std::min<long>(&local_28,
                          (long *)&local_10[0xd].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
  in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)*plVar7;
  local_40[0] = 1;
  plVar7 = std::min<long>(local_40,(long *)&local_10[0xd].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)*plVar7;
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  presolve::HighsPostsolveStack::getOrigNumCol(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  sVar8 = std::vector<double,_std::allocator<double>_>::size(local_10);
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((double)in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage /
                ((double)(int)sVar8 *
                (double)local_10[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start));
  for (local_48 = 0; HVar6 = (HighsInt)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
      local_48 != (int)sVar8; local_48 = local_48 + 1) {
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_48);
    vVar1 = *pvVar9;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)HVar5);
    *pvVar10 = vVar1;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_10 + 1,(long)local_48);
    vVar1 = *pvVar9;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 1,(long)HVar5);
    *pvVar10 = vVar1;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(local_10 + 2),(long)local_48);
    piVar12 = std::min<int>(&local_14,pvVar11);
    iVar4 = *piVar12;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)HVar5);
    *pvVar13 = iVar4;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(local_10 + 3),(long)local_48);
    piVar12 = std::min<int>(&local_14,pvVar11);
    iVar4 = *piVar12;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)HVar5);
    *pvVar13 = iVar4;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_10 + 4,(long)local_48);
    vVar1 = *pvVar9;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 4,(long)HVar5);
    *pvVar10 = vVar1;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_10 + 5,(long)local_48);
    vVar1 = *pvVar9;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 5,(long)HVar5);
    *pvVar10 = vVar1;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)HVar5);
    *pvVar13 = 1;
    HVar5 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)HVar5);
    *pvVar13 = 1;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_10 + 10,(long)local_48);
    dVar2 = *pvVar9;
    pdVar3 = local_10[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = in_RDI + 8;
    HVar6 = presolve::HighsPostsolveStack::getOrigColIndex(in_stack_fffffffffffffdc0,HVar6);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)HVar6);
    *pvVar10 = dVar2 / (double)pdVar3;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_10 + 0xb,(long)local_48)
    ;
    in_stack_fffffffffffffdb8 =
         *pvVar9 / (double)local_10[0xc].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start;
    in_stack_fffffffffffffdc0 = (HighsPostsolveStack *)(in_RDI + 9);
    HVar6 = presolve::HighsPostsolveStack::getOrigColIndex
                      (in_stack_fffffffffffffdc0,
                       (HighsInt)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
                         (long)HVar6);
    *pvVar10 = in_stack_fffffffffffffdb8;
  }
  return;
}

Assistant:

HighsPseudocostInitialization::HighsPseudocostInitialization(
    const HighsPseudocost& pscost, HighsInt maxCount,
    const presolve::HighsPostsolveStack& postsolveStack)
    : cost_total(pscost.cost_total),
      inferences_total(pscost.inferences_total),
      conflict_avg_score(pscost.conflict_avg_score),
      nsamplestotal(std::min(int64_t{1}, pscost.nsamplestotal)),
      ninferencestotal(std::min(int64_t{1}, pscost.ninferencestotal)) {
  pseudocostup.resize(postsolveStack.getOrigNumCol());
  pseudocostdown.resize(postsolveStack.getOrigNumCol());
  nsamplesup.resize(postsolveStack.getOrigNumCol());
  nsamplesdown.resize(postsolveStack.getOrigNumCol());
  inferencesup.resize(postsolveStack.getOrigNumCol());
  inferencesdown.resize(postsolveStack.getOrigNumCol());
  ninferencesup.resize(postsolveStack.getOrigNumCol());
  ninferencesdown.resize(postsolveStack.getOrigNumCol());
  conflictscoreup.resize(postsolveStack.getOrigNumCol());
  conflictscoredown.resize(postsolveStack.getOrigNumCol());

  HighsInt ncols = pscost.pseudocostup.size();
  conflict_avg_score /= ncols * pscost.conflict_weight;

  for (HighsInt i = 0; i != ncols; ++i) {
    pseudocostup[postsolveStack.getOrigColIndex(i)] = pscost.pseudocostup[i];
    pseudocostdown[postsolveStack.getOrigColIndex(i)] =
        pscost.pseudocostdown[i];
    nsamplesup[postsolveStack.getOrigColIndex(i)] =
        std::min(maxCount, pscost.nsamplesup[i]);
    nsamplesdown[postsolveStack.getOrigColIndex(i)] =
        std::min(maxCount, pscost.nsamplesdown[i]);
    inferencesup[postsolveStack.getOrigColIndex(i)] = pscost.inferencesup[i];
    inferencesdown[postsolveStack.getOrigColIndex(i)] =
        pscost.inferencesdown[i];
    ninferencesup[postsolveStack.getOrigColIndex(i)] = 1;
    ninferencesdown[postsolveStack.getOrigColIndex(i)] = 1;
    conflictscoreup[postsolveStack.getOrigColIndex(i)] =
        pscost.conflictscoreup[i] / pscost.conflict_weight;
    conflictscoredown[postsolveStack.getOrigColIndex(i)] =
        pscost.conflictscoredown[i] / pscost.conflict_weight;
  }
}